

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O0

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
NodeView::get_linked_tags_kmers(NodeView *this,string *datastore_name,int K,int min_tag_cov)

{
  LinkedReadsDatastore *this_00;
  undefined4 in_ECX;
  LinkedReadsDatastore *in_RDI;
  undefined4 in_R8D;
  ReadSequenceBuffer ds_buffer;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tags;
  ReadSequenceBuffer *in_stack_000002c0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *in_stack_000002c8;
  int in_stack_000002d0;
  int in_stack_000002d4;
  LinkedReadsDatastore *in_stack_000002d8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  size_t in_stack_ffffffffffffff00;
  LinkedReadsDatastore *this_01;
  string *in_stack_ffffffffffffff48;
  WorkSpace *in_stack_ffffffffffffff50;
  sgNodeID_t in_stack_ffffffffffffff90;
  LinkedReadsMapper *in_stack_ffffffffffffff98;
  
  this_01 = in_RDI;
  WorkSpace::get_linked_reads_datastore(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  LinkedReadsMapper::get_node_tags(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  WorkSpace::get_linked_reads_datastore(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  ReadSequenceBuffer::ReadSequenceBuffer
            ((ReadSequenceBuffer *)this_01,in_RDI,in_stack_ffffffffffffff00,
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  this_00 = WorkSpace::get_linked_reads_datastore
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)this_00,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_R8D,in_ECX));
  LinkedReadsDatastore::get_tags_kmers
            (in_stack_000002d8,in_stack_000002d4,in_stack_000002d0,in_stack_000002c8,
             in_stack_000002c0);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x47dcc6);
  ReadSequenceBuffer::~ReadSequenceBuffer((ReadSequenceBuffer *)this_00);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x47dcdd);
  return (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)this_01;
}

Assistant:

std::unordered_set<uint64_t> NodeView::get_linked_tags_kmers(std::string datastore_name, int K, int min_tag_cov){
    // Get tags
//    auto tags = get_linked_reads(datastore_name);
    std::set<LinkedTag> tags = dg->sdg.ws.get_linked_reads_datastore(datastore_name).mapper.get_node_tags(llabs(id));

    // Get kmers from tags
    ReadSequenceBuffer ds_buffer(dg->sdg.ws.get_linked_reads_datastore(datastore_name));
    return dg->sdg.ws.get_linked_reads_datastore(datastore_name).get_tags_kmers(K, min_tag_cov, tags, ds_buffer);
}